

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O1

void __thiscall
cmGlobalGenerator::AddGlobalTarget_Package
          (cmGlobalGenerator *this,
          vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
          *targets)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  cmMakefile *this_00;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *__s_00;
  string *__x;
  size_t sVar6;
  char *pcVar7;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  string configFile;
  cmCustomCommandLine singleLine;
  string relConfigFile;
  GlobalTargetInfo gti;
  allocator local_149;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_108;
  vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
  *local_f0;
  value_type local_e8;
  undefined1 local_c8 [88];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_70;
  _Alloc_hider local_58;
  char *local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  bool local_38;
  char *__s;
  
  this_00 = *(this->Makefiles).super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  local_f0 = targets;
  iVar5 = (*this->_vptr_cmGlobalGenerator[0xf])();
  __s = (char *)CONCAT44(extraout_var,iVar5);
  local_c8._0_8_ = local_c8 + 0x10;
  local_c8._8_8_ = (char *)0x0;
  local_c8[0x10] = '\0';
  local_c8._32_8_ = local_c8 + 0x30;
  local_c8._40_8_ = (char *)0x0;
  local_c8[0x30] = '\0';
  local_58._M_p = (pointer)&local_48;
  local_c8._64_8_ = (pointer)0x0;
  local_c8._72_8_ = (pointer)0x0;
  local_c8._80_8_ = (pointer)0x0;
  vStack_70.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_70.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_70.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_50 = (char *)0x0;
  local_48._M_local_buf[0] = '\0';
  local_38 = false;
  iVar5 = (*this->_vptr_cmGlobalGenerator[0x19])(this);
  uVar3 = local_c8._8_8_;
  strlen((char *)CONCAT44(extraout_var_00,iVar5));
  std::__cxx11::string::_M_replace((ulong)local_c8,0,(char *)uVar3,CONCAT44(extraout_var_00,iVar5));
  std::__cxx11::string::_M_replace((ulong)(local_c8 + 0x20),0,(char *)local_c8._40_8_,0x63be97);
  local_38 = true;
  __s_00 = cmMakefile::GetCurrentBinaryDirectory(this_00);
  pcVar7 = local_50;
  strlen(__s_00);
  std::__cxx11::string::_M_replace((ulong)&local_58,0,pcVar7,(ulong)__s_00);
  local_108.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __x = cmSystemTools::GetCPackCommand_abi_cxx11_();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_108,__x);
  if (((__s != (char *)0x0) && (*__s != '\0')) && (*__s != '.')) {
    paVar1 = &local_148.field_2;
    local_148._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"-C","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_108,
               &local_148);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != paVar1) {
      operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
    }
    local_148._M_dataplus._M_p = (pointer)paVar1;
    sVar6 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,__s,__s + sVar6);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_108,
               &local_148);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != paVar1) {
      operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
    }
  }
  paVar1 = &local_148.field_2;
  local_148._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"--config","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_108,
             &local_148);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != paVar1) {
    operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
  }
  pcVar7 = cmMakefile::GetCurrentBinaryDirectory(this_00);
  std::__cxx11::string::string((string *)&local_148,pcVar7,(allocator *)&local_e8);
  std::__cxx11::string::append((char *)&local_148);
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"./CPackConfig.cmake","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_108,&local_e8);
  std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::push_back
            ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)(local_c8 + 0x40),
             (value_type *)&local_108);
  iVar5 = (*this->_vptr_cmGlobalGenerator[0x17])(this);
  if (CONCAT44(extraout_var_01,iVar5) == 0) {
    paVar2 = &local_128.field_2;
    local_128._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_128,"CMAKE_SKIP_PACKAGE_ALL_DEPENDENCY","");
    pcVar7 = cmMakefile::GetDefinition(this_00,&local_128);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != paVar2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    if ((pcVar7 != (char *)0x0) && (bVar4 = cmSystemTools::IsOff(pcVar7), !bVar4))
    goto LAB_0033c679;
    iVar5 = (*this->_vptr_cmGlobalGenerator[0x13])(this);
    std::__cxx11::string::string
              ((string *)&local_128,(char *)CONCAT44(extraout_var_03,iVar5),&local_149);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&vStack_70,
               &local_128);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p == paVar2) goto LAB_0033c679;
  }
  else {
    iVar5 = (*this->_vptr_cmGlobalGenerator[0x17])(this);
    std::__cxx11::string::string
              ((string *)&local_128,(char *)CONCAT44(extraout_var_02,iVar5),&local_149);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&vStack_70,
               &local_128);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p == &local_128.field_2) goto LAB_0033c679;
  }
  operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
LAB_0033c679:
  bVar4 = cmsys::SystemTools::FileExists(local_148._M_dataplus._M_p);
  if (bVar4) {
    std::
    vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
    ::push_back(local_f0,(value_type *)local_c8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != paVar1) {
    operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_108);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_p != &local_48) {
    operator_delete(local_58._M_p,
                    CONCAT71(local_48._M_allocated_capacity._1_7_,local_48._M_local_buf[0]) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vStack_70);
  std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector
            ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)(local_c8 + 0x40))
  ;
  if ((undefined1 *)local_c8._32_8_ != local_c8 + 0x30) {
    operator_delete((void *)local_c8._32_8_,CONCAT71(local_c8._49_7_,local_c8[0x30]) + 1);
  }
  if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
    operator_delete((void *)local_c8._0_8_,CONCAT71(local_c8._17_7_,local_c8[0x10]) + 1);
  }
  return;
}

Assistant:

void cmGlobalGenerator::AddGlobalTarget_Package(
  std::vector<GlobalTargetInfo>& targets)
{
  cmMakefile* mf = this->Makefiles[0];
  const char* cmakeCfgIntDir = this->GetCMakeCFGIntDir();
  GlobalTargetInfo gti;
  gti.Name = this->GetPackageTargetName();
  gti.Message = "Run CPack packaging tool...";
  gti.UsesTerminal = true;
  gti.WorkingDir = mf->GetCurrentBinaryDirectory();
  cmCustomCommandLine singleLine;
  singleLine.push_back(cmSystemTools::GetCPackCommand());
  if (cmakeCfgIntDir && *cmakeCfgIntDir && cmakeCfgIntDir[0] != '.') {
    singleLine.push_back("-C");
    singleLine.push_back(cmakeCfgIntDir);
  }
  singleLine.push_back("--config");
  std::string configFile = mf->GetCurrentBinaryDirectory();
  configFile += "/CPackConfig.cmake";
  std::string relConfigFile = "./CPackConfig.cmake";
  singleLine.push_back(relConfigFile);
  gti.CommandLines.push_back(singleLine);
  if (this->GetPreinstallTargetName()) {
    gti.Depends.push_back(this->GetPreinstallTargetName());
  } else {
    const char* noPackageAll =
      mf->GetDefinition("CMAKE_SKIP_PACKAGE_ALL_DEPENDENCY");
    if (!noPackageAll || cmSystemTools::IsOff(noPackageAll)) {
      gti.Depends.push_back(this->GetAllTargetName());
    }
  }
  if (cmSystemTools::FileExists(configFile.c_str())) {
    targets.push_back(gti);
  }
}